

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

ITexture * __thiscall
irr::video::COpenGLDriver::createDeviceDependentTexture
          (COpenGLDriver *this,path *name,IImage *image)

{
  ITexture *pIVar1;
  IImage **in_RDI;
  COpenGLTexture *texture;
  array<irr::video::IImage_*> imageArray;
  array<irr::video::IImage_*> *in_stack_ffffffffffffffb0;
  
  core::array<irr::video::IImage_*>::array(in_stack_ffffffffffffffb0,(u32)((ulong)in_RDI >> 0x20));
  core::array<irr::video::IImage_*>::push_back(in_stack_ffffffffffffffb0,in_RDI);
  pIVar1 = (ITexture *)operator_new(0x108);
  COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
            ((COpenGLCoreTexture<irr::video::COpenGLDriver> *)this,name,
             (array<irr::video::IImage_*> *)image,imageArray._28_4_,
             (COpenGLDriver *)
             imageArray.m_data.
             super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  core::array<irr::video::IImage_*>::~array((array<irr::video::IImage_*> *)0x33ed7f);
  return pIVar1;
}

Assistant:

ITexture *COpenGLDriver::createDeviceDependentTexture(const io::path &name, IImage *image)
{
	core::array<IImage *> imageArray(1);
	imageArray.push_back(image);

	COpenGLTexture *texture = new COpenGLTexture(name, imageArray, ETT_2D, this);

	return texture;
}